

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

void vkt::ssbo::anon_unknown_15::generateWriteSrc
               (ostream *src,BufferLayout *bufferLayout,BufferBlock *block,int instanceNdx,
               BlockDataPtr *blockPtr,BufferVar *bufVar,SubTypeAccess *accessPath)

{
  ostream *poVar1;
  BufferVarLayoutEntry *varLayout;
  BlockDataPtr *accessPath_00;
  BufferVar *accessPath_01;
  undefined4 uVar2;
  int iVar3;
  int ndx;
  void *pvVar4;
  TypeComponentVector *var;
  string apiName;
  VarType curType;
  string shaderName;
  SubTypeAccess local_98;
  VarType local_68;
  string local_50;
  
  accessPath_00 = blockPtr;
  accessPath_01 = bufVar;
  glu::
  getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
            (&local_68,(glu *)accessPath,
             (VarType *)
             (accessPath->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (accessPath->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
              )blockPtr);
  if (local_68.m_type == TYPE_STRUCT) {
    iVar3 = (int)((ulong)(*(long *)(CONCAT44(local_68.m_data.basic.precision,
                                             local_68.m_data.basic.type) + 0x28) -
                         *(long *)(CONCAT44(local_68.m_data.basic.precision,
                                            local_68.m_data.basic.type) + 0x20)) >> 3) * -0x49249249
    ;
    if (0 < iVar3) {
      ndx = 0;
      do {
        glu::SubTypeAccess::member(&local_98,accessPath,ndx);
        generateWriteSrc(src,bufferLayout,block,instanceNdx,blockPtr,bufVar,&local_98);
        if (local_98.m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        glu::VarType::~VarType(&local_98.m_type);
        ndx = ndx + 1;
      } while (iVar3 != ndx);
    }
  }
  else if (local_68.m_type == TYPE_ARRAY) {
    uVar2 = local_68.m_data.array.size;
    if (local_68.m_data.array.size == -1) {
      uVar2 = (block->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_start[instanceNdx];
    }
    if (0 < (int)uVar2) {
      iVar3 = 0;
      do {
        glu::SubTypeAccess::element(&local_98,accessPath,iVar3);
        generateWriteSrc(src,bufferLayout,block,instanceNdx,blockPtr,bufVar,&local_98);
        if (local_98.m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        glu::VarType::~VarType(&local_98.m_type);
        iVar3 = iVar3 + 1;
      } while (uVar2 != iVar3);
    }
  }
  else {
    var = &accessPath->m_path;
    ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
              ((string *)&local_98,(_anonymous_namespace_ *)block,(BufferBlock *)bufVar,
               (BufferVar *)var,(TypeComponentVector *)accessPath_00);
    iVar3 = BufferLayout::getVariableIndex(bufferLayout,(string *)&local_98);
    varLayout = (bufferLayout->bufferVars).
                super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar3;
    ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)block,(BufferBlock *)(ulong)(uint)instanceNdx,
               (int)bufVar,(BufferVar *)var,(TypeComponentVector *)accessPath_01);
    pvVar4 = blockPtr->ptr;
    iVar3 = computeOffset(varLayout,var);
    std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (src,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    pvVar4 = (void *)((long)pvVar4 + (long)iVar3);
    if (local_68.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
        local_68.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
      generateImmMatrixSrc
                (src,local_68.m_data.basic.type,varLayout->matrixStride,varLayout->isRowMajor,pvVar4
                );
    }
    else {
      generateImmScalarVectorSrc(src,local_68.m_data.basic.type,pvVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(src,";\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_98.m_type._0_8_ != (undefined1 *)((long)&local_98 + 0x10U)) {
      operator_delete((void *)local_98.m_type._0_8_,local_98.m_type.m_data._8_8_ + 1);
    }
  }
  glu::VarType::~VarType(&local_68);
  return;
}

Assistant:

void generateWriteSrc (
	std::ostream&				src,
	const BufferLayout&			bufferLayout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			blockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			generateWriteSrc(src, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.element(elemNdx));
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			generateWriteSrc(src, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.member(memberNdx));
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= bufferLayout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry&	varLayout		= bufferLayout.bufferVars[varNdx];
			const string				shaderName		= getShaderName(block, instanceNdx, bufVar, accessPath.getPath());
			const glu::DataType			basicType		= curType.getBasicType();
			const bool					isMatrix		= glu::isDataTypeMatrix(basicType);
			const void*					valuePtr		= (const deUint8*)blockPtr.ptr + computeOffset(varLayout, accessPath.getPath());

			src << "\t" << shaderName << " = ";

			if (isMatrix)
				generateImmMatrixSrc(src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr);
			else
				generateImmScalarVectorSrc(src, basicType, valuePtr);

			src << ";\n";
		}
	}
}